

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O2

void cpsm::
     str_cat_impl<char_const*,unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
               (stringstream *ss,char **x,unsigned_long args,char *args_1,unsigned_long args_2,
               char *args_3,unsigned_long args_4)

{
  unsigned_long local_38;
  
  local_38 = args;
  std::operator<<((ostream *)(ss + 0x10),*x);
  str_cat_impl<unsigned_long,char_const*,unsigned_long,char_const*,unsigned_long>
            (ss,&local_38,args_1,args_2,args_3,args_4);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}